

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS ref_geom_verify_param(REF_GRID ref_grid)

{
  int iVar1;
  REF_GEOM ref_geom;
  REF_NODE pRVar2;
  REF_DBL *pRVar3;
  REF_GRID pRVar4;
  uint uVar5;
  long lVar6;
  REF_MPI ref_mpi;
  long lVar7;
  long lVar8;
  double dVar9;
  REF_DBL max;
  REF_DBL global_max;
  REF_DBL max_node;
  REF_BOOL node_constraint;
  REF_DBL max_edge;
  REF_DBL xyz [3];
  REF_BOOL edge_constraint;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  int local_74;
  REF_MPI local_70;
  REF_GRID local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  int local_34;
  
  ref_geom = ref_grid->geom;
  if (ref_geom->model == (void *)0x0) {
    uVar5 = 0;
  }
  else {
    ref_mpi = ref_grid->mpi;
    pRVar2 = ref_grid->node;
    local_98 = 0.0;
    local_70 = ref_mpi;
    local_68 = ref_grid;
    if (0 < ref_geom->max) {
      lVar8 = 0;
      lVar6 = 0;
      do {
        if ((*(int *)((long)ref_geom->descr + lVar8) == 0) &&
           (lVar7 = (long)*(int *)((long)ref_geom->descr + lVar8 + 0x14),
           ref_mpi->id == pRVar2->part[lVar7])) {
          uVar5 = ref_egads_eval(ref_geom,(REF_INT)lVar6,&local_58,(REF_DBL *)0x0);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x761,"ref_geom_verify_param",(ulong)uVar5,"eval xyz");
            return uVar5;
          }
          pRVar3 = pRVar2->real;
          dVar9 = (local_48 - pRVar3[lVar7 * 0xf + 2]) * (local_48 - pRVar3[lVar7 * 0xf + 2]) +
                  (local_50 - pRVar3[lVar7 * 0xf + 1]) * (local_50 - pRVar3[lVar7 * 0xf + 1]) +
                  (local_58 - pRVar3[lVar7 * 0xf]) * (local_58 - pRVar3[lVar7 * 0xf]);
          if (dVar9 < 0.0) {
            dVar9 = sqrt(dVar9);
          }
          else {
            dVar9 = SQRT(dVar9);
          }
          ref_mpi = local_70;
          if (local_98 <= dVar9) {
            local_98 = dVar9;
          }
        }
        lVar6 = lVar6 + 1;
        lVar8 = lVar8 + 0x18;
      } while (lVar6 < ref_geom->max);
    }
    uVar5 = ref_mpi_max(ref_mpi,&local_98,&local_90,3);
    if (uVar5 == 0) {
      local_98 = local_90;
      if (local_68->mpi->id == 0) {
        printf("CAD topo node max eval dist %e\n");
      }
      local_98 = 0.0;
      local_88 = 0.0;
      if (0 < ref_geom->max) {
        lVar8 = 0;
        lVar6 = 0;
        do {
          if (*(int *)((long)ref_geom->descr + lVar8) == 1) {
            iVar1 = *(int *)((long)ref_geom->descr + lVar8 + 0x14);
            lVar7 = (long)iVar1;
            if (ref_mpi->id == pRVar2->part[lVar7]) {
              uVar5 = ref_egads_eval(ref_geom,(REF_INT)lVar6,&local_58,(REF_DBL *)0x0);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x770,"ref_geom_verify_param",(ulong)uVar5,"eval xyz");
                return uVar5;
              }
              pRVar3 = pRVar2->real;
              dVar9 = (local_48 - pRVar3[lVar7 * 0xf + 2]) * (local_48 - pRVar3[lVar7 * 0xf + 2]) +
                      (local_50 - pRVar3[lVar7 * 0xf + 1]) * (local_50 - pRVar3[lVar7 * 0xf + 1]) +
                      (local_58 - pRVar3[lVar7 * 0xf]) * (local_58 - pRVar3[lVar7 * 0xf]);
              if (dVar9 < 0.0) {
                local_80 = sqrt(dVar9);
              }
              else {
                local_80 = SQRT(dVar9);
              }
              ref_mpi = local_70;
              ref_geom_is_a(ref_geom,iVar1,0,&local_74);
              if (local_74 == 0) {
                if (local_98 <= local_80) {
                  local_98 = local_80;
                }
              }
              else if (local_88 <= local_80) {
                local_88 = local_80;
              }
            }
          }
          lVar6 = lVar6 + 1;
          lVar8 = lVar8 + 0x18;
        } while (lVar6 < ref_geom->max);
      }
      uVar5 = ref_mpi_max(ref_mpi,&local_98,&local_90,3);
      if (uVar5 == 0) {
        local_98 = local_90;
        if (local_68->mpi->id == 0) {
          printf("CAD topo edge max eval dist %e\n");
        }
        uVar5 = ref_mpi_max(ref_mpi,&local_88,&local_90,3);
        if (uVar5 == 0) {
          local_88 = local_90;
          if (local_68->mpi->id == 0) {
            printf("CAD topo edge node tol %e\n");
          }
          local_98 = 0.0;
          local_88 = 0.0;
          local_60 = 0.0;
          if (0 < ref_geom->max) {
            lVar6 = 0;
            lVar8 = 0;
            do {
              if (*(int *)((long)ref_geom->descr + lVar6) == 2) {
                iVar1 = *(int *)((long)ref_geom->descr + lVar6 + 0x14);
                lVar7 = (long)iVar1;
                if (ref_mpi->id == pRVar2->part[lVar7]) {
                  uVar5 = ref_egads_eval(ref_geom,(REF_INT)lVar8,&local_58,(REF_DBL *)0x0);
                  if (uVar5 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                           ,0x789,"ref_geom_verify_param",(ulong)uVar5,"eval xyz");
                    return uVar5;
                  }
                  pRVar3 = pRVar2->real;
                  dVar9 = (local_48 - pRVar3[lVar7 * 0xf + 2]) *
                          (local_48 - pRVar3[lVar7 * 0xf + 2]) +
                          (local_50 - pRVar3[lVar7 * 0xf + 1]) *
                          (local_50 - pRVar3[lVar7 * 0xf + 1]) +
                          (local_58 - pRVar3[lVar7 * 0xf]) * (local_58 - pRVar3[lVar7 * 0xf]);
                  if (dVar9 < 0.0) {
                    local_80 = sqrt(dVar9);
                  }
                  else {
                    local_80 = SQRT(dVar9);
                  }
                  ref_mpi = local_70;
                  ref_geom_is_a(ref_geom,iVar1,0,&local_74);
                  ref_geom_is_a(ref_geom,iVar1,1,&local_34);
                  if (local_74 == 0) {
                    if (local_34 == 0) {
                      if (local_98 <= local_80) {
                        local_98 = local_80;
                      }
                    }
                    else if (local_60 <= local_80) {
                      local_60 = local_80;
                    }
                  }
                  else if (local_88 <= local_80) {
                    local_88 = local_80;
                  }
                }
              }
              lVar8 = lVar8 + 1;
              lVar6 = lVar6 + 0x18;
            } while (lVar8 < ref_geom->max);
          }
          uVar5 = ref_mpi_max(ref_mpi,&local_98,&local_90,3);
          pRVar4 = local_68;
          if (uVar5 == 0) {
            local_98 = local_90;
            if (local_68->mpi->id == 0) {
              printf("CAD topo face max eval dist %e\n");
            }
            uVar5 = ref_mpi_max(ref_mpi,&local_60,&local_90,3);
            if (uVar5 == 0) {
              local_60 = local_90;
              if (pRVar4->mpi->id == 0) {
                printf("CAD topo face edge tol %e\n");
              }
              uVar5 = ref_mpi_max(ref_mpi,&local_88,&local_90,3);
              if (uVar5 == 0) {
                local_88 = local_90;
                uVar5 = 0;
                if (pRVar4->mpi->id == 0) {
                  printf("CAD topo face node tol %e\n");
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x7a1,"ref_geom_verify_param",(ulong)uVar5,"mpi max edge");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0x79d,"ref_geom_verify_param",(ulong)uVar5,"mpi max edge");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x799,"ref_geom_verify_param",(ulong)uVar5,"mpi max face");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x77f,"ref_geom_verify_param",(ulong)uVar5,"mpi max edge");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x77b,"ref_geom_verify_param",(ulong)uVar5,"mpi max edge");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x767,
             "ref_geom_verify_param",(ulong)uVar5,"mpi max node");
    }
  }
  return uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_geom_verify_param(REF_GRID ref_grid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT geom;
  REF_INT node;
  REF_DBL xyz[3];
  REF_DBL dist, max, max_node, max_edge, global_max;
  REF_BOOL node_constraint, edge_constraint;

  if (!ref_geom_model_loaded(ref_geom)) return REF_SUCCESS;

  max = 0.0;
  each_ref_geom_node(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    if (ref_mpi_rank(ref_mpi) != ref_node_part(ref_node, node)) continue;
    RSS(ref_egads_eval(ref_geom, geom, xyz, NULL), "eval xyz");
    dist = sqrt(pow(xyz[0] - ref_node_xyz(ref_node, 0, node), 2) +
                pow(xyz[1] - ref_node_xyz(ref_node, 1, node), 2) +
                pow(xyz[2] - ref_node_xyz(ref_node, 2, node), 2));
    max = MAX(max, dist);
  }
  RSS(ref_mpi_max(ref_mpi, &max, &global_max, REF_DBL_TYPE), "mpi max node");
  max = global_max;
  if (ref_grid_once(ref_grid)) printf("CAD topo node max eval dist %e\n", max);

  max = 0.0;
  max_node = 0.0;
  each_ref_geom_edge(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    if (ref_mpi_rank(ref_mpi) != ref_node_part(ref_node, node)) continue;
    RSS(ref_egads_eval(ref_geom, geom, xyz, NULL), "eval xyz");
    dist = sqrt(pow(xyz[0] - ref_node_xyz(ref_node, 0, node), 2) +
                pow(xyz[1] - ref_node_xyz(ref_node, 1, node), 2) +
                pow(xyz[2] - ref_node_xyz(ref_node, 2, node), 2));
    RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_NODE, &node_constraint), "n");
    if (node_constraint) {
      max_node = MAX(max_node, dist);
    } else {
      max = MAX(max, dist);
    }
  }
  RSS(ref_mpi_max(ref_mpi, &max, &global_max, REF_DBL_TYPE), "mpi max edge");
  max = global_max;
  if (ref_grid_once(ref_grid)) printf("CAD topo edge max eval dist %e\n", max);
  RSS(ref_mpi_max(ref_mpi, &max_node, &global_max, REF_DBL_TYPE),
      "mpi max edge");
  max_node = global_max;
  if (ref_grid_once(ref_grid)) printf("CAD topo edge node tol %e\n", max_node);

  max = 0.0;
  max_node = 0.0;
  max_edge = 0.0;
  each_ref_geom_face(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    if (ref_mpi_rank(ref_mpi) != ref_node_part(ref_node, node)) continue;
    RSS(ref_egads_eval(ref_geom, geom, xyz, NULL), "eval xyz");
    dist = sqrt(pow(xyz[0] - ref_node_xyz(ref_node, 0, node), 2) +
                pow(xyz[1] - ref_node_xyz(ref_node, 1, node), 2) +
                pow(xyz[2] - ref_node_xyz(ref_node, 2, node), 2));
    RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_NODE, &node_constraint), "n");
    RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_EDGE, &edge_constraint), "n");
    if (node_constraint) {
      max_node = MAX(max_node, dist);
    } else {
      if (edge_constraint) {
        max_edge = MAX(max_edge, dist);
      } else {
        max = MAX(max, dist);
      }
    }
  }
  RSS(ref_mpi_max(ref_mpi, &max, &global_max, REF_DBL_TYPE), "mpi max face");
  max = global_max;
  if (ref_grid_once(ref_grid)) printf("CAD topo face max eval dist %e\n", max);
  RSS(ref_mpi_max(ref_mpi, &max_edge, &global_max, REF_DBL_TYPE),
      "mpi max edge");
  max_edge = global_max;
  if (ref_grid_once(ref_grid)) printf("CAD topo face edge tol %e\n", max_edge);
  RSS(ref_mpi_max(ref_mpi, &max_node, &global_max, REF_DBL_TYPE),
      "mpi max edge");
  max_node = global_max;
  if (ref_grid_once(ref_grid)) printf("CAD topo face node tol %e\n", max_node);

  return REF_SUCCESS;
}